

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifierUtil.cpp
# Opt level: O0

void vkt::texture::util::calcTexelGridCoordRange
               (Vec3 *unnormalizedCoordMin,Vec3 *unnormalizedCoordMax,int coordBits,
               IVec3 *gridCoordMin,IVec3 *gridCoordMax)

{
  int iVar1;
  int iVar2;
  int iVar3;
  float *pfVar4;
  int *piVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  deInt32 subTexelGridCoordMax;
  deInt32 subTexelGridCoordMin;
  deInt32 nearestTexelGridOffsetMax;
  deInt32 nearestTexelGridOffsetMin;
  int ndx;
  double intPart [2];
  float fracPart [2];
  float comp [2];
  int compNdx;
  int subdivisions;
  IVec3 *gridCoordMax_local;
  IVec3 *gridCoordMin_local;
  int coordBits_local;
  Vec3 *unnormalizedCoordMax_local;
  Vec3 *unnormalizedCoordMin_local;
  
  iVar1 = 1 << ((byte)coordBits & 0x1f);
  for (comp[0] = 0.0; (int)comp[0] < 3; comp[0] = (float)((int)comp[0] + 1)) {
    pfVar4 = tcu::Vector<float,_3>::operator[](unnormalizedCoordMin,(int)comp[0]);
    fracPart[0] = *pfVar4;
    pfVar4 = tcu::Vector<float,_3>::operator[](unnormalizedCoordMax,(int)comp[0]);
    fracPart[1] = *pfVar4;
    for (nearestTexelGridOffsetMax = 0; nearestTexelGridOffsetMax < 2;
        nearestTexelGridOffsetMax = nearestTexelGridOffsetMax + 1) {
      dVar6 = deModf((double)fracPart[nearestTexelGridOffsetMax],
                     (double *)(&nearestTexelGridOffsetMin + (long)nearestTexelGridOffsetMax * 2));
      fracPart[(long)nearestTexelGridOffsetMax + -2] = (float)dVar6;
      if (fracPart[nearestTexelGridOffsetMax] <= 0.0 && fracPart[nearestTexelGridOffsetMax] != 0.0)
      {
        *(double *)(&nearestTexelGridOffsetMin + (long)nearestTexelGridOffsetMax * 2) =
             *(double *)(&nearestTexelGridOffsetMin + (long)nearestTexelGridOffsetMax * 2) - 1.0;
        fracPart[(long)nearestTexelGridOffsetMax + -2] =
             fracPart[(long)nearestTexelGridOffsetMax + -2] + 1.0;
      }
    }
    dVar6 = deFloor(_nearestTexelGridOffsetMin);
    dVar7 = deFloor(intPart[0]);
    dVar8 = deFloor((double)(intPart[1]._0_4_ * (float)iVar1));
    iVar2 = de::max<int>((int)dVar8,0);
    dVar8 = deCeil((double)(intPart[1]._4_4_ * (float)iVar1));
    iVar3 = de::min<int>((int)dVar8,iVar1 + -1);
    piVar5 = tcu::Vector<int,_3>::operator[](gridCoordMin,(int)comp[0]);
    *piVar5 = (int)dVar6 * iVar1 + iVar2;
    piVar5 = tcu::Vector<int,_3>::operator[](gridCoordMax,(int)comp[0]);
    *piVar5 = (int)dVar7 * iVar1 + iVar3;
  }
  return;
}

Assistant:

void calcTexelGridCoordRange (const Vec3&	unnormalizedCoordMin,
							  const Vec3&	unnormalizedCoordMax,
							  const int		coordBits,
							  IVec3&		gridCoordMin,
							  IVec3&		gridCoordMax)
{
	const int subdivisions = 1 << coordBits;

	for (int compNdx = 0; compNdx < 3; ++compNdx)
	{
		const float comp[2] = {unnormalizedCoordMin[compNdx],
							   unnormalizedCoordMax[compNdx]};

		float	fracPart[2];
		double	intPart[2];

		for (int ndx = 0; ndx < 2; ++ndx)
		{
			fracPart[ndx] = (float) deModf(comp[ndx], &intPart[ndx]);

			if (comp[ndx] < 0.0f)
			{
				intPart [ndx] -= 1.0;
				fracPart[ndx] += 1.0f;
			}
		}

		const deInt32	nearestTexelGridOffsetMin = (deInt32) deFloor(intPart[0]);
		const deInt32	nearestTexelGridOffsetMax = (deInt32) deFloor(intPart[1]);

		const deInt32	subTexelGridCoordMin	  = de::max((deInt32) deFloor(fracPart[0] * (float) subdivisions), (deInt32) 0);
		const deInt32	subTexelGridCoordMax	  = de::min((deInt32) deCeil (fracPart[1] * (float) subdivisions), (deInt32) (subdivisions - 1));

	    gridCoordMin[compNdx] = nearestTexelGridOffsetMin * (deInt32) subdivisions + subTexelGridCoordMin;
	    gridCoordMax[compNdx] = nearestTexelGridOffsetMax * (deInt32) subdivisions + subTexelGridCoordMax;
	}
}